

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

char duckdb::Cast::Operation<double,signed_char>(double input)

{
  bool bVar1;
  InvalidInputException *this;
  double in_XMM0_Qa;
  char result;
  double in_stack_000001a8;
  string local_30 [39];
  signed local_9 [9];
  
  bVar1 = duckdb::TryCast::Operation<double,signed_char>(in_XMM0_Qa,local_9,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<double,signed_char>(in_stack_000001a8);
    duckdb::InvalidInputException::InvalidInputException(this,local_30);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return (char)local_9[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}